

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O3

Client * __thiscall
capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
          (Client *__return_storage_ptr__,Pipeline *this)

{
  long *plVar1;
  ArrayDisposer *pAVar2;
  undefined8 uVar3;
  undefined1 local_48 [24];
  long *local_30;
  ArrayDisposer *local_28;
  undefined8 uStack_20;
  undefined8 *local_18;
  
  ::capnp::AnyPointer::Pipeline::getPointerField((Pipeline *)(local_48 + 0x10),&this->_typeless,1);
  ::capnp::AnyPointer::Pipeline::asCap((Pipeline *)local_48);
  uVar3 = uStack_20;
  pAVar2 = local_28;
  *(undefined4 *)&__return_storage_ptr__->field_0x8 = local_48._0_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_48._4_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x10 = local_48._8_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = local_48._12_4_;
  local_48._8_8_ = (PipelineHook *)0x0;
  __return_storage_ptr__->_vptr_Client = (_func_int **)&TestCallOrder::Client::typeinfo;
  if (local_28 != (ArrayDisposer *)0x0) {
    local_28 = (ArrayDisposer *)0x0;
    uStack_20 = 0;
    (**(code **)*local_18)(local_18,pAVar2,8,uVar3,uVar3,0);
  }
  plVar1 = local_30;
  if (local_30 != (long *)0x0) {
    local_30 = (long *)0x0;
    (**(code **)*(PipelineOp *)local_48._16_8_)
              (local_48._16_8_,*(long *)(*plVar1 + -0x10) + (long)plVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnproto_test::capnp::test::TestCallOrder::Client TestTailCallee::TailResult::Pipeline::getC() {
  return  ::capnproto_test::capnp::test::TestCallOrder::Client(_typeless.getPointerField(1).asCap());
}